

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int unicode_decomp_entry(uint32_t *res,uint32_t c,int idx,uint32_t code,uint32_t len,uint32_t type)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint8_t *p_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t c_min;
  uint32_t p_1;
  uint32_t k;
  uint8_t *d;
  int p;
  int i;
  int l;
  uint32_t c1;
  uint local_44;
  byte *local_40;
  int local_34;
  int local_30;
  int local_2c;
  uint local_28;
  uint32_t local_14;
  int local_4;
  
  if (in_R9D == 0) {
    *in_RDI = (uint)unicode_decomp_table2[in_EDX];
    return 1;
  }
  uVar1 = unicode_decomp_table2[in_EDX];
  p_00 = unicode_decomp_data + uVar1;
  switch(in_R9D) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    for (local_30 = 0; local_4 = in_R9D, local_30 < in_R9D; local_30 = local_30 + 1) {
      uVar2 = unicode_get16(p_00 + (long)(local_30 << 1) +
                                   (ulong)(uint)((in_ESI - in_ECX) * in_R9D * 2));
      in_RDI[local_30] = (uint)uVar2;
      if (uVar2 == 0) {
        return 0;
      }
    }
    break;
  case 8:
  case 9:
    local_4 = in_R9D + -7;
    local_44 = (in_ESI - in_ECX) * local_4;
    for (local_30 = 0; local_30 < local_4; local_30 = local_30 + 1) {
      uVar2 = unicode_get16(p_00 + (local_44 << 1));
      uVar3 = (uint)uVar2 |
              ((int)(uint)p_00[in_R8D * local_4 * 2 + (local_44 >> 2)] >>
               (sbyte)((local_44 & 3) << 1) & 3U) << 0x10;
      if (uVar3 == 0) {
        return 0;
      }
      in_RDI[local_30] = uVar3;
      local_44 = local_44 + 1;
    }
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    local_4 = in_R9D + -9;
    for (local_30 = 0; local_30 < local_4; local_30 = local_30 + 1) {
      uVar4 = unicode_get_short_code
                        ((uint)p_00[(long)local_30 + (ulong)(uint)((in_ESI - in_ECX) * local_4)]);
      in_RDI[local_30] = uVar4;
      if (uVar4 == 0) {
        return 0;
      }
    }
    break;
  case 0xf:
    local_2c = 1;
    local_34 = 0;
    goto LAB_001d1949;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    local_2c = (in_R9D - 0x10U >> 1) + 2;
    local_34 = (in_R9D - 0x10U & 1) + (uint)(2 < local_2c);
LAB_001d1949:
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      uVar2 = unicode_get16(p_00 + (local_30 << 1));
      local_28 = (uint)uVar2;
      if (local_30 == local_34) {
        local_28 = (in_ESI - in_ECX) + local_28;
      }
      in_RDI[local_30] = local_28;
    }
    local_4 = local_2c;
    break;
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    local_2c = in_R9D + -0x15;
    goto LAB_001d19d4;
  case 0x1e:
    local_2c = 0x12;
LAB_001d19d4:
    uVar2 = unicode_get16(p_00);
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      if (p_00[(long)local_30 + (ulong)((in_ESI - in_ECX) * local_2c + 2)] == 0xff) {
        local_28 = 0x20;
      }
      else {
        local_28 = (uint)uVar2 +
                   (uint)p_00[(long)local_30 + (ulong)((in_ESI - in_ECX) * local_2c + 2)];
      }
      in_RDI[local_30] = local_28;
    }
    local_4 = local_2c;
    break;
  case 0x1f:
    uVar2 = unicode_get16(p_00 + (uint)((in_ESI - in_ECX) * 3));
    *in_RDI = (uint)uVar2;
    if (uVar2 == 0) {
      local_4 = 0;
    }
    else {
      uVar4 = unicode_get_short_code((uint)(p_00 + (uint)((in_ESI - in_ECX) * 3))[2]);
      in_RDI[1] = uVar4;
      local_4 = 2;
    }
    break;
  case 0x20:
    uVar2 = unicode_get16(p_00);
    *in_RDI = (uint)uVar2;
    uVar2 = unicode_get16(unicode_decomp_data + (ulong)uVar1 + 2);
    in_RDI[2] = (uint)uVar2;
    uVar2 = unicode_get16(p_00 + ((in_ESI - in_ECX) * 2 + 4));
    in_RDI[1] = (uint)uVar2;
    local_4 = 3;
    break;
  case 0x21:
  case 0x22:
    uVar3 = in_ESI - in_ECX;
    if (in_R9D == 0x21) {
      local_14 = unicode_get_short_code((uint)p_00[uVar3 & 0xfffffffe]);
      local_40 = p_00 + (uVar3 & 0xfffffffe) + 1;
    }
    else {
      uVar2 = unicode_get16(p_00 + (uVar3 >> 1) * 3);
      local_14 = (uint32_t)uVar2;
      local_40 = p_00 + (uVar3 >> 1) * 3 + 2;
    }
    if ((uVar3 & 1) != 0) {
      local_14 = unicode_get_lower_simple(local_14);
    }
    *in_RDI = local_14;
    uVar4 = unicode_get_short_code((uint)*local_40);
    in_RDI[1] = uVar4;
    local_4 = 2;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int unicode_decomp_entry(uint32_t *res, uint32_t c,
                                int idx, uint32_t code, uint32_t len,
                                uint32_t type)
{
    uint32_t c1;
    int l, i, p;
    const uint8_t *d;

    if (type == DECOMP_TYPE_C1) {
        res[0] = unicode_decomp_table2[idx];
        return 1;
    } else {
        d = unicode_decomp_data + unicode_decomp_table2[idx];
        switch(type) {
        case DECOMP_TYPE_L1:
        case DECOMP_TYPE_L2:
        case DECOMP_TYPE_L3:
        case DECOMP_TYPE_L4:
        case DECOMP_TYPE_L5:
        case DECOMP_TYPE_L6:
        case DECOMP_TYPE_L7:
            l = type - DECOMP_TYPE_L1 + 1;
            d += (c - code) * l * 2;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get16(d + 2 * i)) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_LL1:
        case DECOMP_TYPE_LL2:
            {
                uint32_t k, p;
                l = type - DECOMP_TYPE_LL1 + 1;
                k = (c - code) * l;
                p = len * l * 2;
                for(i = 0; i < l; i++) {
                    c1 = unicode_get16(d + 2 * k) |
                        (((d[p + (k / 4)] >> ((k % 4) * 2)) & 3) << 16);
                    if (!c1)
                        return 0;
                    res[i] = c1;
                    k++;
                }
            }
            return l;
        case DECOMP_TYPE_S1:
        case DECOMP_TYPE_S2:
        case DECOMP_TYPE_S3:
        case DECOMP_TYPE_S4:
        case DECOMP_TYPE_S5:
            l = type - DECOMP_TYPE_S1 + 1;
            d += (c - code) * l;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get_short_code(d[i])) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_I1:
            l = 1;
            p = 0;
            goto decomp_type_i;
        case DECOMP_TYPE_I2_0:
        case DECOMP_TYPE_I2_1:
        case DECOMP_TYPE_I3_1:
        case DECOMP_TYPE_I3_2:
        case DECOMP_TYPE_I4_1:
        case DECOMP_TYPE_I4_2:
            l = 2 + ((type - DECOMP_TYPE_I2_0) >> 1);
            p = ((type - DECOMP_TYPE_I2_0) & 1) + (l > 2);
        decomp_type_i:
            for(i = 0; i < l; i++) {
                c1 = unicode_get16(d + 2 * i);
                if (i == p)
                    c1 += c - code;
                res[i] = c1;
            }
            return l;
        case DECOMP_TYPE_B18:
            l = 18;
            goto decomp_type_b;
        case DECOMP_TYPE_B1:
        case DECOMP_TYPE_B2:
        case DECOMP_TYPE_B3:
        case DECOMP_TYPE_B4:
        case DECOMP_TYPE_B5:
        case DECOMP_TYPE_B6:
        case DECOMP_TYPE_B7:
        case DECOMP_TYPE_B8:
            l = type - DECOMP_TYPE_B1 + 1;
        decomp_type_b:
            {
                uint32_t c_min;
                c_min = unicode_get16(d);
                d += 2 + (c - code) * l;
                for(i = 0; i < l; i++) {
                    c1 = d[i];
                    if (c1 == 0xff)
                        c1 = 0x20;
                    else
                        c1 += c_min;
                    res[i] = c1;
                }
            }
            return l;
        case DECOMP_TYPE_LS2:
            d += (c - code) * 3;
            if (!(res[0] = unicode_get16(d)))
                return 0;
            res[1] = unicode_get_short_code(d[2]);
            return 2;
        case DECOMP_TYPE_PAT3:
            res[0] = unicode_get16(d);
            res[2] = unicode_get16(d + 2);
            d += 4 + (c - code) * 2;
            res[1] = unicode_get16(d);
            return 3;
        case DECOMP_TYPE_S2_UL:
        case DECOMP_TYPE_LS2_UL:
            c1 = c - code;
            if (type == DECOMP_TYPE_S2_UL) {
                d += c1 & ~1;
                c = unicode_get_short_code(*d);
                d++;
            } else {
                d += (c1 >> 1) * 3;
                c = unicode_get16(d);
                d += 2;
            }
            if (c1 & 1)
                c = unicode_get_lower_simple(c);
            res[0] = c;
            res[1] = unicode_get_short_code(*d);
            return 2;
        }
    }
    return 0;
}